

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O2

void __thiscall json_service::both(json_service *this,string *msg)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  runtime_error *this_00;
  value avStack_1b8 [4];
  ostringstream oss;
  
  cVar1 = cppcms::rpc::json_rpc_server::notification();
  if (cVar1 == '\0') {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,"call:"
                   ,msg);
    cppcms::json::value::value<std::__cxx11::string>
              (avStack_1b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss
              );
    cppcms::rpc::json_rpc_server::return_result((value *)this);
    cppcms::json::value::copyable::~copyable(&avStack_1b8[0].d);
    std::__cxx11::string::~string((string *)&oss);
  }
  else {
    bVar2 = std::operator==(msg,"notification");
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      poVar3 = std::operator<<((ostream *)&oss,"Error ");
      poVar3 = std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,0x4e);
      std::operator<<(poVar3," msg==\"notification\"");
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this_00,(string *)avStack_1b8);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

void both(std::string msg)
	{
		if(notification())
			TEST(msg=="notification");
		else
			return_result("call:"+msg);
	}